

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cscript.c
# Opt level: O2

void envy_bios_print_i2cscript(envy_bios *bios,FILE *out,uint mask)

{
  uint16_t soff;
  envy_bios_bit_entry *peVar1;
  
  peVar1 = (bios->i2cscript).bit;
  if ((mask >> 0xb & 1) != 0 && peVar1 != (envy_bios_bit_entry *)0x0) {
    if ((bios->i2cscript).valid == '\0') {
      fprintf((FILE *)out,"Failed to parse BIT table \'2\' at 0x%04x version 1\n\n",
              (ulong)peVar1->t_offset);
      return;
    }
    if ((((int)mask < 0) || ((bios->i2cscript).unk00 != 0)) || ((bios->i2cscript).script != 0)) {
      fwrite("I2C script",10,1,(FILE *)out);
      if ((bios->i2cscript).unk00 != 0) {
        fprintf((FILE *)out," unk00 0x%04x");
      }
      if ((bios->i2cscript).script != 0) {
        fputc(0x3a,(FILE *)out);
      }
      fputc(10,(FILE *)out);
      peVar1 = (bios->i2cscript).bit;
      envy_bios_dump_hex(bios,out,(uint)peVar1->t_offset,(uint)peVar1->t_len,mask);
      soff = (bios->i2cscript).script;
      if (soff != 0) {
        printscript(soff);
      }
      fputc(10,(FILE *)out);
      return;
    }
  }
  return;
}

Assistant:

void envy_bios_print_i2cscript (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_i2cscript *i2cscript = &bios->i2cscript;
	if (!i2cscript->bit || !(mask & ENVY_BIOS_PRINT_I2CSCRIPT))
		return;
	if (!i2cscript->valid) {
		fprintf(out, "Failed to parse BIT table '2' at 0x%04x version 1\n\n", i2cscript->bit->t_offset);
		return;
	}
	if ((mask & ENVY_BIOS_PRINT_VERBOSE) || i2cscript->unk00 || i2cscript->script) {
		fprintf(out, "I2C script");
		if (i2cscript->unk00)
			fprintf(out, " unk00 0x%04x", i2cscript->unk00);
		if (i2cscript->script)
			fprintf(out, ":");
		fprintf(out, "\n");
		envy_bios_dump_hex(bios, out, i2cscript->bit->t_offset, i2cscript->bit->t_len, mask);
		if (i2cscript->script)
			printscript(i2cscript->script);
		fprintf(out, "\n");
	}
}